

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

void __thiscall bandit::reporter::spec::context_starting(spec *this,string *desc)

{
  ostream *poVar1;
  string local_38;
  string *local_18;
  string *desc_local;
  spec *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::context_starting((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_38,this);
  std::operator<<(poVar1,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<((this->super_colored_base).stm_,"describe ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  increase_indent(this);
  std::ostream::flush();
  return;
}

Assistant:

void context_starting(const std::string& desc) override {
        progress_base::context_starting(desc);

        stm_ << indent();
        stm_ << "describe " << desc << std::endl;
        increase_indent();
        stm_.flush();
      }